

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::HandleLocationPropertyPolicy(cmTarget *this,cmMakefile *context)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  char *pcVar4;
  MessageType t;
  string local_1c0;
  ostringstream e;
  
  if (this->IsImportedTarget != false) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar1 = cmMakefile::GetPolicyStatus(context,CMP0026);
  if (PVar1 - NEW < 3) {
    t = FATAL_ERROR;
    pcVar4 = "may";
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (PVar1 != WARN) goto LAB_0038643c;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x1a,id);
    poVar2 = std::operator<<((ostream *)&e,(string *)&local_1c0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    t = AUTHOR_WARNING;
    bVar3 = true;
    pcVar4 = "should";
  }
  poVar2 = std::operator<<((ostream *)&e,"The LOCATION property ");
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," not be read from target \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->Name);
  std::operator<<(poVar2,
                  "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
                 );
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(context,t,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
LAB_0038643c:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return bVar3;
}

Assistant:

bool cmTarget::HandleLocationPropertyPolicy(cmMakefile* context) const
{
  if (this->IsImported())
    {
    return true;
    }
  std::ostringstream e;
  const char *modal = 0;
  cmake::MessageType messageType = cmake::AUTHOR_WARNING;
  switch (context->GetPolicyStatus(cmPolicies::CMP0026))
    {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = cmake::FATAL_ERROR;
    }

  if (modal)
    {
    e << "The LOCATION property " << modal << " not be read from target \""
      << this->GetName() << "\".  Use the target name directly with "
      "add_custom_command, or use the generator expression $<TARGET_FILE>, "
      "as appropriate.\n";
    context->IssueMessage(messageType, e.str());
    }

  return messageType != cmake::FATAL_ERROR;
}